

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__tga_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  uchar uVar1;
  stbi_uc asVar2 [4];
  stbi_uc sVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  byte *pbVar8;
  stbi_uc *psVar9;
  stbi_uc *psVar10;
  byte *pbVar11;
  undefined7 uVar12;
  uchar *puVar13;
  uint uVar14;
  ulong uVar15;
  char cVar16;
  ulong uVar17;
  int iVar18;
  uint *puVar19;
  byte bVar20;
  uint *puVar21;
  uint uVar22;
  long lVar23;
  bool bVar24;
  bool bVar25;
  uchar raw_data [4];
  uint local_90;
  stbi_uc local_8c [4];
  uint *local_88;
  uint local_80;
  undefined4 local_7c;
  ulong local_78;
  uint local_6c;
  uint local_68;
  uint local_64;
  stbi_uc *local_60;
  stbi_uc *local_58;
  uint *local_50;
  undefined4 local_44;
  uint *local_40;
  uint local_34;
  
  pbVar11 = s->img_buffer;
  if (pbVar11 < s->img_buffer_end) {
LAB_0016c653:
    s->img_buffer = pbVar11 + 1;
    local_90 = (uint)*pbVar11;
    pbVar11 = pbVar11 + 1;
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar9 = s->buffer_start;
      iVar4 = (*(s->io).read)(s->io_user_data,(char *)psVar9,s->buflen);
      if (iVar4 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar9;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar9;
        s->img_buffer_end = psVar9 + iVar4;
      }
      pbVar11 = s->img_buffer;
      goto LAB_0016c653;
    }
    local_90 = 0;
    pbVar11 = (byte *)comp;
  }
  psVar9 = s->img_buffer;
  local_50 = (uint *)x;
  local_40 = (uint *)y;
  local_34 = req_comp;
  if (psVar9 < s->img_buffer_end) {
LAB_0016c6e0:
    pbVar11 = psVar9 + 1;
    s->img_buffer = pbVar11;
    uVar17 = CONCAT71((int7)((ulong)x >> 8),*psVar9 != '\0');
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar9 = s->buffer_start;
      iVar4 = (*(s->io).read)(s->io_user_data,(char *)psVar9,s->buflen);
      if (iVar4 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar9;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar9;
        s->img_buffer_end = psVar9 + iVar4;
      }
      psVar9 = s->img_buffer;
      goto LAB_0016c6e0;
    }
    uVar17 = 0;
  }
  psVar9 = s->img_buffer;
  if (psVar9 < s->img_buffer_end) {
LAB_0016c765:
    pbVar11 = psVar9 + 1;
    s->img_buffer = pbVar11;
    local_68 = (uint)CONCAT71((int7)((ulong)psVar9 >> 8),*psVar9);
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar9 = s->buffer_start;
      iVar4 = (*(s->io).read)(s->io_user_data,(char *)psVar9,s->buflen);
      if (iVar4 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar9;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar9;
        s->img_buffer_end = psVar9 + iVar4;
      }
      psVar9 = s->img_buffer;
      goto LAB_0016c765;
    }
    local_68 = 0;
  }
  uVar5 = stbi__get16le(s);
  uVar15 = (ulong)uVar5;
  local_6c = stbi__get16le(s);
  pbVar8 = s->img_buffer;
  local_58 = (stbi_uc *)CONCAT44(local_58._4_4_,uVar5);
  local_88 = (uint *)comp;
  if (pbVar8 < s->img_buffer_end) {
LAB_0016c803:
    pbVar11 = pbVar8 + 1;
    s->img_buffer = pbVar11;
    bVar20 = *pbVar8;
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar9 = s->buffer_start;
      iVar4 = (*(s->io).read)(s->io_user_data,(char *)psVar9,s->buflen);
      if (iVar4 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar9;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar9;
        s->img_buffer_end = psVar9 + iVar4;
      }
      pbVar8 = s->img_buffer;
      goto LAB_0016c803;
    }
    bVar20 = 0;
  }
  stbi__get16le(s);
  stbi__get16le(s);
  uVar5 = stbi__get16le(s);
  uVar6 = stbi__get16le(s);
  psVar9 = s->img_buffer;
  if (psVar9 < s->img_buffer_end) {
LAB_0016c8b3:
    pbVar11 = psVar9 + 1;
    s->img_buffer = pbVar11;
    uVar14 = (uint)CONCAT71((int7)(uVar15 >> 8),*psVar9);
  }
  else {
    if (s->read_from_callbacks != 0) {
      uVar15 = uVar17 & 0xffffffff;
      psVar9 = s->buffer_start;
      iVar4 = (*(s->io).read)(s->io_user_data,(char *)psVar9,s->buflen);
      if (iVar4 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar9;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar9;
        s->img_buffer_end = psVar9 + iVar4;
      }
      psVar9 = s->img_buffer;
      goto LAB_0016c8b3;
    }
    uVar14 = 0;
  }
  pbVar8 = s->img_buffer;
  if (pbVar8 < s->img_buffer_end) {
LAB_0016c945:
    pbVar11 = pbVar8 + 1;
    s->img_buffer = pbVar11;
    bVar25 = (*pbVar8 & 0x20) == 0;
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar9 = s->buffer_start;
      local_64 = uVar14;
      iVar4 = (*(s->io).read)(s->io_user_data,(char *)psVar9,s->buflen);
      if (iVar4 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar9;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar9;
        s->img_buffer_end = psVar9 + iVar4;
      }
      pbVar8 = s->img_buffer;
      uVar14 = local_64;
      goto LAB_0016c945;
    }
    bVar25 = true;
  }
  local_8c[0] = '\0';
  local_8c[1] = '\0';
  local_8c[2] = '\0';
  local_8c[3] = '\0';
  cVar16 = (char)uVar17;
  uVar12 = (undefined7)((ulong)pbVar11 >> 8);
  if (cVar16 == '\0') {
    uVar22 = uVar14 & 0xff;
    local_7c = (undefined4)CONCAT71(uVar12,1);
    if (uVar22 < 0x10) {
      if (uVar22 != 8) {
        if (uVar22 == 0xf) {
LAB_0016c9fb:
          uVar22 = 3;
          local_44 = 1;
          local_7c = 0;
          goto LAB_0016ca42;
        }
LAB_0016ca31:
        local_44 = 0;
        uVar22 = 0;
        goto LAB_0016ca42;
      }
      uVar22 = 1;
    }
    else if ((uVar22 == 0x20) || (uVar22 == 0x18)) {
      uVar22 = uVar14 >> 3 & 0x1f;
    }
    else {
      if (uVar22 != 0x10) goto LAB_0016ca31;
      uVar22 = (local_68 & 0xff) - 8;
      if ((byte)local_68 < 8) {
        uVar22 = local_68 & 0xff;
      }
      if (uVar22 != 3) goto LAB_0016c9fb;
      uVar22 = uVar22 == 3 ^ 3;
    }
    local_44 = 0;
  }
  else {
    local_7c = (undefined4)CONCAT71(uVar12,1);
    if (bVar20 < 0x18) {
      if (bVar20 - 0xf < 2) {
        uVar22 = 3;
        local_44 = 1;
        local_7c = 0;
      }
      else {
        if (bVar20 != 8) goto LAB_0016ca38;
        uVar22 = 1;
LAB_0016ca23:
        local_44 = 0;
      }
    }
    else {
      if ((bVar20 == 0x18) || (bVar20 == 0x20)) {
        uVar22 = (uint)(bVar20 >> 3);
        goto LAB_0016ca23;
      }
LAB_0016ca38:
      local_44 = 0;
      uVar22 = 0;
    }
  }
LAB_0016ca42:
  if (uVar22 == 0) {
    stbi__g_failure_reason = "bad format";
    return (void *)0x0;
  }
  *local_50 = uVar5;
  *local_40 = uVar6;
  if (local_88 != (uint *)0x0) {
    *local_88 = uVar22;
  }
  iVar4 = stbi__mad3sizes_valid(uVar5,uVar6,uVar22,0);
  if (iVar4 == 0) {
    stbi__g_failure_reason = "too large";
    return (void *)0x0;
  }
  local_78 = (ulong)uVar6;
  local_88 = (uint *)stbi__malloc_mad3(uVar5,uVar6,uVar22,0);
  if (local_88 != (uint *)0x0) {
    bVar24 = (byte)local_68 < 8;
    local_64 = uVar14;
    stbi__skip(s,local_90);
    puVar21 = local_88;
    local_80 = uVar5;
    if ((cVar16 == '\0' && (char)local_44 == '\0') && bVar24) {
      if ((int)local_78 != 0) {
        iVar7 = 0;
        iVar4 = (int)local_78;
        do {
          iVar4 = iVar4 + -1;
          iVar18 = iVar7;
          if (bVar25) {
            iVar18 = iVar4;
          }
          stbi__getn(s,(stbi_uc *)((long)puVar21 + (long)(int)(iVar18 * uVar22 * uVar5)),
                     uVar22 * uVar5);
          iVar7 = iVar7 + 1;
        } while (iVar4 != 0);
      }
    }
    else {
      if (cVar16 == '\0') {
        local_60 = (stbi_uc *)0x0;
      }
      else {
        stbi__skip(s,(int)local_58);
        psVar9 = (stbi_uc *)stbi__malloc_mad2(local_6c,uVar22,0);
        if (psVar9 == (stbi_uc *)0x0) {
          free(local_88);
          goto LAB_0016cbb2;
        }
        local_60 = psVar9;
        if ((char)local_7c == '\0') {
          if (uVar22 != 3) {
            __assert_fail("tga_comp == STBI_rgb",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/fjzzq2002[P]MiniShader/stb_image.h"
                          ,0x15e6,
                          "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                         );
          }
          uVar5 = local_80;
          if (local_6c != 0) {
            iVar4 = local_6c * 3;
            lVar23 = 0;
            do {
              uVar5 = stbi__get16le(s);
              psVar9[lVar23] = (stbi_uc)((ulong)((uVar5 >> 10 & 0x1f) * 0xff) * 0x8421085 >> 0x20);
              psVar9[lVar23 + 1] =
                   (stbi_uc)((ulong)((uVar5 >> 5 & 0x1f) * 0xff) * 0x8421085 >> 0x20);
              psVar9[lVar23 + 2] = (stbi_uc)((ulong)((uVar5 & 0x1f) * 0xff) * 0x8421085 >> 0x20);
              lVar23 = lVar23 + 3;
              uVar5 = local_80;
            } while (iVar4 != (int)lVar23);
          }
        }
        else {
          iVar4 = stbi__getn(s,psVar9,uVar22 * local_6c);
          if (iVar4 == 0) {
            free(local_88);
            free(psVar9);
            stbi__g_failure_reason = "bad palette";
            return (void *)0x0;
          }
        }
      }
      uVar5 = (int)local_78 * uVar5;
      if (uVar5 != 0) {
        psVar9 = s->buffer_start;
        local_58 = s->buffer_start + 1;
        uVar17 = (ulong)(uVar22 + (uVar22 == 0));
        local_40 = (uint *)(ulong)uVar5;
        puVar21 = (uint *)0x0;
        bVar20 = 0;
        local_50 = (uint *)((ulong)local_50 & 0xffffffff00000000);
        iVar4 = 0;
        do {
          if ((byte)local_68 < 8) {
LAB_0016cd5f:
            bVar24 = false;
          }
          else {
            if (iVar4 == 0) {
              pbVar11 = s->img_buffer;
              if (pbVar11 < s->img_buffer_end) {
LAB_0016cd40:
                s->img_buffer = pbVar11 + 1;
                uVar5 = (uint)*pbVar11;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  iVar4 = (*(s->io).read)(s->io_user_data,(char *)psVar9,s->buflen);
                  if (iVar4 == 0) {
                    s->read_from_callbacks = 0;
                    s->img_buffer = psVar9;
                    s->img_buffer_end = local_58;
                    s->buffer_start[0] = '\0';
                  }
                  else {
                    s->img_buffer = psVar9;
                    s->img_buffer_end = psVar9 + iVar4;
                  }
                  pbVar11 = s->img_buffer;
                  goto LAB_0016cd40;
                }
                uVar5 = 0;
              }
              iVar4 = (uVar5 & 0x7f) + 1;
              local_50 = (uint *)CONCAT44(local_50._4_4_,uVar5 >> 7);
              goto LAB_0016cd5f;
            }
            bVar24 = (bool)(bVar20 & (int)local_50 != 0);
            local_50 = (uint *)CONCAT44(local_50._4_4_,(uint)((int)local_50 != 0));
          }
          psVar10 = local_60;
          if (!bVar24) {
            if (cVar16 == '\0') {
              if ((char)local_7c == '\0') {
                if (uVar22 != 3) {
                  __assert_fail("tga_comp == STBI_rgb",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/fjzzq2002[P]MiniShader/stb_image.h"
                                ,0x1617,
                                "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                               );
                }
                uVar5 = stbi__get16le(s);
                asVar2 = local_8c;
                local_8c[1] = (char)((ulong)((uVar5 >> 5 & 0x1f) * 0xff) * 0x8421085 >> 0x20);
                local_8c[0] = (char)((ulong)((uVar5 >> 10 & 0x1f) * 0xff) * 0x8421085 >> 0x20);
                local_8c[3] = asVar2[3];
                local_8c[2] = (char)((ulong)((uVar5 & 0x1f) * 0xff) * 0x8421085 >> 0x20);
              }
              else {
                uVar15 = 0;
                do {
                  psVar10 = s->img_buffer;
                  if (psVar10 < s->img_buffer_end) {
LAB_0016ce45:
                    s->img_buffer = psVar10 + 1;
                    sVar3 = *psVar10;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar9,s->buflen);
                      if (iVar7 == 0) {
                        s->read_from_callbacks = 0;
                        s->img_buffer = psVar9;
                        s->img_buffer_end = local_58;
                        s->buffer_start[0] = '\0';
                      }
                      else {
                        s->img_buffer = psVar9;
                        s->img_buffer_end = psVar9 + iVar7;
                      }
                      psVar10 = s->img_buffer;
                      goto LAB_0016ce45;
                    }
                    sVar3 = '\0';
                  }
                  local_8c[uVar15] = sVar3;
                  uVar15 = uVar15 + 1;
                } while (uVar17 != uVar15);
              }
            }
            else {
              if ((char)local_64 == '\b') {
                pbVar11 = s->img_buffer;
                if (s->img_buffer_end <= pbVar11) {
                  if (s->read_from_callbacks == 0) {
                    uVar5 = 0;
                    goto LAB_0016cf22;
                  }
                  iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar9,s->buflen);
                  if (iVar7 == 0) {
                    s->read_from_callbacks = 0;
                    s->img_buffer = psVar9;
                    s->img_buffer_end = local_58;
                    s->buffer_start[0] = '\0';
                  }
                  else {
                    s->img_buffer = psVar9;
                    s->img_buffer_end = psVar9 + iVar7;
                  }
                  pbVar11 = s->img_buffer;
                }
                s->img_buffer = pbVar11 + 1;
                uVar5 = (uint)*pbVar11;
              }
              else {
                uVar5 = stbi__get16le(s);
                psVar10 = local_60;
              }
LAB_0016cf22:
              if (local_6c <= uVar5) {
                uVar5 = 0;
              }
              memcpy(local_8c,psVar10 + uVar5 * uVar22,uVar17);
            }
          }
          memcpy((uchar *)((long)local_88 + (ulong)(uVar22 * (int)puVar21)),local_8c,uVar17);
          iVar4 = iVar4 + -1;
          puVar21 = (uint *)((long)puVar21 + 1);
          bVar20 = 1;
        } while (puVar21 != local_40);
      }
      puVar21 = local_88;
      if (bVar25 && (int)local_78 != 0) {
        iVar4 = uVar22 * local_80;
        iVar7 = iVar4 * ((int)local_78 - 1U);
        uVar6 = 0;
        uVar5 = 0;
        do {
          if (iVar4 != 0) {
            puVar19 = local_88;
            iVar18 = iVar4 + 1;
            do {
              uVar1 = *(uchar *)((long)puVar19 + (ulong)uVar6);
              *(uchar *)((long)puVar19 + (ulong)uVar6) = *(uchar *)((long)puVar19 + (long)iVar7);
              *(uchar *)((long)puVar19 + (long)iVar7) = uVar1;
              puVar19 = (uint *)((long)puVar19 + 1);
              iVar18 = iVar18 + -1;
            } while (1 < iVar18);
          }
          iVar7 = iVar7 - iVar4;
          uVar6 = uVar6 + iVar4;
          bVar25 = uVar5 != (int)local_78 - 1U >> 1;
          uVar5 = uVar5 + 1;
        } while (bVar25);
      }
      if (local_60 != (stbi_uc *)0x0) {
        free(local_60);
      }
    }
    if (((char)local_44 == '\0' && 2 < uVar22) && (iVar4 = (uint)local_78 * local_80, iVar4 != 0)) {
      puVar13 = (uchar *)((long)puVar21 + 2);
      do {
        uVar1 = puVar13[-2];
        puVar13[-2] = *puVar13;
        *puVar13 = uVar1;
        puVar13 = puVar13 + uVar22;
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
    if (local_34 != 0) {
      if (uVar22 != local_34) {
        puVar13 = stbi__convert_format((uchar *)puVar21,uVar22,local_34,local_80,(uint)local_78);
        return puVar13;
      }
      return (uchar *)puVar21;
    }
    return (uchar *)puVar21;
  }
LAB_0016cbb2:
  stbi__g_failure_reason = "outofmem";
  return (void *)0x0;
}

Assistant:

static void *stbi__tga_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   //   read in the TGA header stuff
   int tga_offset = stbi__get8(s);
   int tga_indexed = stbi__get8(s);
   int tga_image_type = stbi__get8(s);
   int tga_is_RLE = 0;
   int tga_palette_start = stbi__get16le(s);
   int tga_palette_len = stbi__get16le(s);
   int tga_palette_bits = stbi__get8(s);
   int tga_x_origin = stbi__get16le(s);
   int tga_y_origin = stbi__get16le(s);
   int tga_width = stbi__get16le(s);
   int tga_height = stbi__get16le(s);
   int tga_bits_per_pixel = stbi__get8(s);
   int tga_comp, tga_rgb16=0;
   int tga_inverted = stbi__get8(s);
   // int tga_alpha_bits = tga_inverted & 15; // the 4 lowest bits - unused (useless?)
   //   image data
   unsigned char *tga_data;
   unsigned char *tga_palette = NULL;
   int i, j;
   unsigned char raw_data[4] = {0};
   int RLE_count = 0;
   int RLE_repeating = 0;
   int read_next_pixel = 1;
   STBI_NOTUSED(ri);
   STBI_NOTUSED(tga_x_origin); // @TODO
   STBI_NOTUSED(tga_y_origin); // @TODO

   //   do a tiny bit of precessing
   if ( tga_image_type >= 8 )
   {
      tga_image_type -= 8;
      tga_is_RLE = 1;
   }
   tga_inverted = 1 - ((tga_inverted >> 5) & 1);

   //   If I'm paletted, then I'll use the number of bits from the palette
   if ( tga_indexed ) tga_comp = stbi__tga_get_comp(tga_palette_bits, 0, &tga_rgb16);
   else tga_comp = stbi__tga_get_comp(tga_bits_per_pixel, (tga_image_type == 3), &tga_rgb16);

   if(!tga_comp) // shouldn't really happen, stbi__tga_test() should have ensured basic consistency
      return stbi__errpuc("bad format", "Can't find out TGA pixelformat");

   //   tga info
   *x = tga_width;
   *y = tga_height;
   if (comp) *comp = tga_comp;

   if (!stbi__mad3sizes_valid(tga_width, tga_height, tga_comp, 0))
      return stbi__errpuc("too large", "Corrupt TGA");

   tga_data = (unsigned char*)stbi__malloc_mad3(tga_width, tga_height, tga_comp, 0);
   if (!tga_data) return stbi__errpuc("outofmem", "Out of memory");

   // skip to the data's starting position (offset usually = 0)
   stbi__skip(s, tga_offset );

   if ( !tga_indexed && !tga_is_RLE && !tga_rgb16 ) {
      for (i=0; i < tga_height; ++i) {
         int row = tga_inverted ? tga_height -i - 1 : i;
         stbi_uc *tga_row = tga_data + row*tga_width*tga_comp;
         stbi__getn(s, tga_row, tga_width * tga_comp);
      }
   } else  {
      //   do I need to load a palette?
      if ( tga_indexed)
      {
         //   any data to skip? (offset usually = 0)
         stbi__skip(s, tga_palette_start );
         //   load the palette
         tga_palette = (unsigned char*)stbi__malloc_mad2(tga_palette_len, tga_comp, 0);
         if (!tga_palette) {
            STBI_FREE(tga_data);
            return stbi__errpuc("outofmem", "Out of memory");
         }
         if (tga_rgb16) {
            stbi_uc *pal_entry = tga_palette;
            STBI_ASSERT(tga_comp == STBI_rgb);
            for (i=0; i < tga_palette_len; ++i) {
               stbi__tga_read_rgb16(s, pal_entry);
               pal_entry += tga_comp;
            }
         } else if (!stbi__getn(s, tga_palette, tga_palette_len * tga_comp)) {
               STBI_FREE(tga_data);
               STBI_FREE(tga_palette);
               return stbi__errpuc("bad palette", "Corrupt TGA");
         }
      }
      //   load the data
      for (i=0; i < tga_width * tga_height; ++i)
      {
         //   if I'm in RLE mode, do I need to get a RLE stbi__pngchunk?
         if ( tga_is_RLE )
         {
            if ( RLE_count == 0 )
            {
               //   yep, get the next byte as a RLE command
               int RLE_cmd = stbi__get8(s);
               RLE_count = 1 + (RLE_cmd & 127);
               RLE_repeating = RLE_cmd >> 7;
               read_next_pixel = 1;
            } else if ( !RLE_repeating )
            {
               read_next_pixel = 1;
            }
         } else
         {
            read_next_pixel = 1;
         }
         //   OK, if I need to read a pixel, do it now
         if ( read_next_pixel )
         {
            //   load however much data we did have
            if ( tga_indexed )
            {
               // read in index, then perform the lookup
               int pal_idx = (tga_bits_per_pixel == 8) ? stbi__get8(s) : stbi__get16le(s);
               if ( pal_idx >= tga_palette_len ) {
                  // invalid index
                  pal_idx = 0;
               }
               pal_idx *= tga_comp;
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = tga_palette[pal_idx+j];
               }
            } else if(tga_rgb16) {
               STBI_ASSERT(tga_comp == STBI_rgb);
               stbi__tga_read_rgb16(s, raw_data);
            } else {
               //   read in the data raw
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = stbi__get8(s);
               }
            }
            //   clear the reading flag for the next pixel
            read_next_pixel = 0;
         } // end of reading a pixel

         // copy data
         for (j = 0; j < tga_comp; ++j)
           tga_data[i*tga_comp+j] = raw_data[j];

         //   in case we're in RLE mode, keep counting down
         --RLE_count;
      }
      //   do I need to invert the image?
      if ( tga_inverted )
      {
         for (j = 0; j*2 < tga_height; ++j)
         {
            int index1 = j * tga_width * tga_comp;
            int index2 = (tga_height - 1 - j) * tga_width * tga_comp;
            for (i = tga_width * tga_comp; i > 0; --i)
            {
               unsigned char temp = tga_data[index1];
               tga_data[index1] = tga_data[index2];
               tga_data[index2] = temp;
               ++index1;
               ++index2;
            }
         }
      }
      //   clear my palette, if I had one
      if ( tga_palette != NULL )
      {
         STBI_FREE( tga_palette );
      }
   }

   // swap RGB - if the source data was RGB16, it already is in the right order
   if (tga_comp >= 3 && !tga_rgb16)
   {
      unsigned char* tga_pixel = tga_data;
      for (i=0; i < tga_width * tga_height; ++i)
      {
         unsigned char temp = tga_pixel[0];
         tga_pixel[0] = tga_pixel[2];
         tga_pixel[2] = temp;
         tga_pixel += tga_comp;
      }
   }

   // convert to target component count
   if (req_comp && req_comp != tga_comp)
      tga_data = stbi__convert_format(tga_data, tga_comp, req_comp, tga_width, tga_height);

   //   the things I do to get rid of an error message, and yet keep
   //   Microsoft's C compilers happy... [8^(
   tga_palette_start = tga_palette_len = tga_palette_bits =
         tga_x_origin = tga_y_origin = 0;
   STBI_NOTUSED(tga_palette_start);
   //   OK, done
   return tga_data;
}